

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::SetElementIHelper
               (Var receiver,RecyclableObject *object,Var index,Var value,
               ScriptContext *scriptContext,PropertyOperationFlags flags)

{
  code *pcVar1;
  PropertyRecordUsageCache *propertyString;
  bool bVar2;
  IndexType IVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  uint uVar6;
  Var local_70;
  Var index_local;
  RecyclableObject *cacheOwner;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  JavascriptString *propertyNameString;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  uint32 local_38;
  PropertyOperationFlags local_34;
  uint32 indexVal;
  
  local_38 = 0;
  local_48 = (PropertyRecord *)0x0;
  propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
  local_70 = index;
  propertyRecord = (PropertyRecord *)value;
  bVar2 = GetPropertyRecordUsageCache
                    (index,scriptContext,(PropertyRecordUsageCache **)&cacheOwner,
                     (RecyclableObject **)&index_local);
  if (bVar2) {
    bVar2 = SetElementIWithCache<false>
                      (receiver,object,(RecyclableObject *)index_local,propertyRecord,
                       (PropertyRecordUsageCache *)cacheOwner,scriptContext,flags,
                       (PropertyCacheOperationInfo *)0x0);
  }
  else {
    propertyNameString = (JavascriptString *)object;
    local_34 = flags;
    bVar2 = TaggedNumber::Is(receiver);
    if (!bVar2) {
      bVar2 = TaggedInt::Is(index);
      uVar6 = 0;
      if (!bVar2) {
        bVar2 = VarIs<Js::JavascriptString>(index);
        uVar6 = (uint)bVar2;
      }
      scriptContext->forinNoCache = scriptContext->forinNoCache + uVar6;
      IVar3 = GetIndexType(&local_70,scriptContext,&local_38,&local_48,
                           (JavascriptString **)&propertyRecordUsageCache,false,true);
      propertyString = propertyRecordUsageCache;
      if (((scriptContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) !=
           DisableImplicitNoFlag) &&
         (scriptContext->threadContext->implicitCallFlags != ImplicitCall_None)) {
        return 0;
      }
      if (IVar3 == IndexType_JavascriptString) {
        if (propertyRecordUsageCache == (PropertyRecordUsageCache *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x12c3,"(propertyNameString)","propertyNameString");
          if (!bVar2) {
LAB_0099e640:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
        if ((local_48 != (PropertyRecord *)0x0) ||
           (ScriptContext::GetOrAddPropertyRecord
                      (scriptContext,(JavascriptString *)propertyString,&local_48),
           local_48->isNumeric != true)) goto LAB_0099e61e;
        local_38 = PropertyRecord::GetNumericValue(local_48);
      }
      else if (IVar3 != IndexType_Number) {
        if (local_48 == (PropertyRecord *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x12d5,"(propertyRecord)","propertyRecord");
          if (!bVar2) goto LAB_0099e640;
          *puVar5 = 0;
        }
LAB_0099e61e:
        BVar4 = SetProperty(receiver,&propertyNameString->super_RecyclableObject,local_48->pid,
                            propertyRecord,scriptContext,local_34);
        return BVar4;
      }
      BVar4 = SetItem(receiver,&propertyNameString->super_RecyclableObject,local_38,propertyRecord,
                      scriptContext,local_34,0);
      return BVar4;
    }
    bVar2 = SetElementIOnTaggedNumber
                      (receiver,&propertyNameString->super_RecyclableObject,index,propertyRecord,
                       scriptContext,local_34);
  }
  return (uint)bVar2;
}

Assistant:

BOOL JavascriptOperators::SetElementIHelper(Var receiver, RecyclableObject* object, Var index, Var value, ScriptContext* scriptContext, PropertyOperationFlags flags)
    {
        IndexType indexType;
        uint32 indexVal = 0;
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptString * propertyNameString = nullptr;
        PropertyValueInfo propertyValueInfo;

        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        if (JavascriptOperators::GetPropertyRecordUsageCache(index, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            return JavascriptOperators::SetElementIWithCache<false>(receiver, object, cacheOwner, value, propertyRecordUsageCache, scriptContext, flags, nullptr);
        }

        if (TaggedNumber::Is(receiver))
        {
            return JavascriptOperators::SetElementIOnTaggedNumber(receiver, object, index, value, scriptContext, flags);
        }

#if DBG_DUMP
        scriptContext->forinNoCache += (!TaggedInt::Is(index) && VarIs<JavascriptString>(index));
#endif
        indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, false, true);
        if (scriptContext->GetThreadContext()->IsDisableImplicitCall() &&
            scriptContext->GetThreadContext()->GetImplicitCallFlags() != ImplicitCall_None)
        {
            // We hit an implicit call trying to convert the index, and implicit calls are disabled, so
            // quit before we try to store the element.
            return FALSE;
        }

        if (indexType == IndexType_Number)
        {
SetElementIHelper_INDEX_TYPE_IS_NUMBER:
            return JavascriptOperators::SetItem(receiver, object, indexVal, value, scriptContext, flags);
        }
        else if (indexType == IndexType_JavascriptString)
        {
            Assert(propertyNameString);

            // At this point, we know that the propertyNameString is neither PropertyString
            // or LiteralStringWithPropertyStringPtr.. Get PropertyRecord!
            // we will get it anyways otherwise. (Also, 1:1 string comparison for Builtin types will be expensive.)

            if (propertyRecord == nullptr)
            {
                scriptContext->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
                if (propertyRecord->IsNumeric())
                {
                    indexVal = propertyRecord->GetNumericValue();
                    goto SetElementIHelper_INDEX_TYPE_IS_NUMBER;
                }
            }
        }

        Assert(indexType == IndexType_PropertyId || indexType == IndexType_JavascriptString);
        Assert(propertyRecord);
        return JavascriptOperators::SetProperty(receiver, object, propertyRecord->GetPropertyId(), value, scriptContext, flags);
    }